

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall glcts::anon_unknown_0::BasicMax::Check(BasicMax *this,GLenum target,GLint min_value)

{
  GLboolean local_35;
  float local_34;
  GLboolean b;
  ulong uStack_30;
  GLfloat f;
  GLint64 i64;
  uint local_20;
  GLint i;
  GLint min_value_local;
  GLenum target_local;
  BasicMax *this_local;
  
  local_20 = min_value;
  i = target;
  _min_value_local = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,target,(GLint *)((long)&i64 + 4));
  if ((int)i64._4_4_ < (int)local_20) {
    anon_unknown_0::Output("Is %d should be at least %d.\n",(ulong)i64._4_4_,(ulong)local_20);
    this_local._7_1_ = false;
  }
  else {
    glu::CallLogWrapper::glGetInteger64v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,i,(GLint64 *)&stack0xffffffffffffffd0);
    if ((int)uStack_30 < (int)local_20) {
      anon_unknown_0::Output
                ("Is %d should be at least %d.\n",uStack_30 & 0xffffffff,(ulong)local_20);
      this_local._7_1_ = false;
    }
    else {
      glu::CallLogWrapper::glGetFloatv
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,i,&local_34);
      if ((int)local_34 < (int)local_20) {
        anon_unknown_0::Output
                  ("Is %d should be at least %d.\n",(ulong)(uint)(int)local_34,(ulong)local_20);
        this_local._7_1_ = false;
      }
      else {
        glu::CallLogWrapper::glGetBooleanv
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,i,&local_35);
        if (local_35 == '\0') {
          anon_unknown_0::Output("Is GL_FALSE should be at least GL_TRUE.\n");
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Check(GLenum target, const GLint min_value)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLboolean b;

		glGetIntegerv(target, &i);
		if (i < min_value)
		{
			Output("Is %d should be at least %d.\n", i, min_value);
			return false;
		}
		glGetInteger64v(target, &i64);
		if (static_cast<GLint>(i64) < min_value)
		{
			Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_value);
			return false;
		}
		glGetFloatv(target, &f);
		if (static_cast<GLint>(f) < min_value)
		{
			Output("Is %d should be at least %d.\n", static_cast<GLint>(f), min_value);
			return false;
		}
		glGetBooleanv(target, &b);
		if (b == GL_FALSE)
		{
			Output("Is GL_FALSE should be at least GL_TRUE.\n");
			return false;
		}

		return true;
	}